

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateMergeFromMethods
          (MessageGenerator *this,Printer *printer)

{
  scoped_array<const_google::protobuf::FieldDescriptor_*> sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Type type;
  WireType type_00;
  FieldDescriptor **ppFVar5;
  string *value;
  FieldGenerator *pFVar6;
  uint i_00;
  uint i_01;
  string local_88;
  uint32 local_64;
  undefined1 local_60 [4];
  uint32 packed_tag;
  uint32 local_3c;
  FieldDescriptor *pFStack_38;
  uint32 tag;
  FieldDescriptor *field;
  int i;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_20;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  sorted_fields.array_ = (FieldDescriptor **)printer;
  ppFVar5 = anon_unknown_0::SortFieldsByNumber(this->descriptor_);
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::scoped_array(&local_20,ppFVar5)
  ;
  sVar1 = sorted_fields;
  value = Descriptor::name_abi_cxx11_(this->descriptor_);
  io::Printer::Print((Printer *)sVar1.array_,
                     "\n@Override\npublic $classname$ mergeFrom(\n        com.google.protobuf.nano.CodedInputByteBufferNano input)\n    throws java.io.IOException {\n"
                     ,"classname",value);
  io::Printer::Indent((Printer *)sorted_fields.array_);
  bVar2 = HasMapField(this->descriptor_);
  if (bVar2) {
    io::Printer::Print((Printer *)sorted_fields.array_,
                       "com.google.protobuf.nano.MapFactories.MapFactory mapFactory =\n  com.google.protobuf.nano.MapFactories.getMapFactory();\n"
                      );
  }
  io::Printer::Print((Printer *)sorted_fields.array_,"while (true) {\n");
  io::Printer::Indent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"int tag = input.readTag();\nswitch (tag) {\n")
  ;
  io::Printer::Indent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"case 0:\n  return this;\ndefault: {\n");
  io::Printer::Indent((Printer *)sorted_fields.array_);
  bVar2 = Params::store_unknown_fields(this->params_);
  if (bVar2) {
    io::Printer::Print((Printer *)sorted_fields.array_,
                       "if (!storeUnknownField(input, tag)) {\n  return this;\n}\n");
  }
  else {
    io::Printer::Print((Printer *)sorted_fields.array_,
                       "if (!com.google.protobuf.nano.WireFormatNano.parseUnknownField(input, tag)) {\n  return this;\n}\n"
                      );
  }
  io::Printer::Print((Printer *)sorted_fields.array_,"break;\n");
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"}\n");
  for (field._0_4_ = 0; iVar4 = (int)field, iVar3 = Descriptor::field_count(this->descriptor_),
      iVar4 < iVar3; field._0_4_ = (int)field + 1) {
    ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        (&local_20,(long)(int)field);
    pFStack_38 = *ppFVar5;
    iVar4 = FieldDescriptor::number(pFStack_38);
    type = FieldDescriptor::type(pFStack_38);
    type_00 = internal::WireFormat::WireTypeForFieldType(type);
    local_3c = internal::WireFormatLite::MakeTag(iVar4,type_00);
    sVar1 = sorted_fields;
    SimpleItoa_abi_cxx11_((string *)local_60,(protobuf *)(ulong)local_3c,i_00);
    io::Printer::Print((Printer *)sVar1.array_,"case $tag$: {\n","tag",(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    io::Printer::Indent((Printer *)sorted_fields.array_);
    pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFStack_38);
    (*pFVar6->_vptr_FieldGenerator[6])(pFVar6,sorted_fields.array_);
    io::Printer::Outdent((Printer *)sorted_fields.array_);
    io::Printer::Print((Printer *)sorted_fields.array_,"  break;\n}\n");
    bVar2 = FieldDescriptor::is_packable(pFStack_38);
    if (bVar2) {
      iVar4 = FieldDescriptor::number(pFStack_38);
      local_64 = internal::WireFormatLite::MakeTag(iVar4,WIRETYPE_LENGTH_DELIMITED);
      sVar1 = sorted_fields;
      SimpleItoa_abi_cxx11_(&local_88,(protobuf *)(ulong)local_64,i_01);
      io::Printer::Print((Printer *)sVar1.array_,"case $tag$: {\n","tag",&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      io::Printer::Indent((Printer *)sorted_fields.array_);
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFStack_38);
      (*pFVar6->_vptr_FieldGenerator[7])(pFVar6,sorted_fields.array_);
      io::Printer::Outdent((Printer *)sorted_fields.array_);
      io::Printer::Print((Printer *)sorted_fields.array_,"  break;\n}\n");
    }
  }
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"    }\n  }\n}\n");
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array(&local_20);
  return;
}

Assistant:

void MessageGenerator::GenerateMergeFromMethods(io::Printer* printer) {
  scoped_array<const FieldDescriptor*> sorted_fields(
    SortFieldsByNumber(descriptor_));

  printer->Print(
    "\n"
    "@Override\n"
    "public $classname$ mergeFrom(\n"
    "        com.google.protobuf.nano.CodedInputByteBufferNano input)\n"
    "    throws java.io.IOException {\n",
    "classname", descriptor_->name());

  printer->Indent();
  if (HasMapField(descriptor_)) {
    printer->Print(
      "com.google.protobuf.nano.MapFactories.MapFactory mapFactory =\n"
      "  com.google.protobuf.nano.MapFactories.getMapFactory();\n");
  }

  printer->Print(
    "while (true) {\n");
  printer->Indent();

  printer->Print(
    "int tag = input.readTag();\n"
    "switch (tag) {\n");
  printer->Indent();

  printer->Print(
    "case 0:\n"          // zero signals EOF / limit reached
    "  return this;\n"
    "default: {\n");

  printer->Indent();
  if (params_.store_unknown_fields()) {
    printer->Print(
        "if (!storeUnknownField(input, tag)) {\n"
        "  return this;\n"
        "}\n");
  } else {
    printer->Print(
        "if (!com.google.protobuf.nano.WireFormatNano.parseUnknownField(input, tag)) {\n"
        "  return this;\n"   // it's an endgroup tag
        "}\n");
  }
  printer->Print("break;\n");
  printer->Outdent();
  printer->Print("}\n");

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    uint32 tag = WireFormatLite::MakeTag(field->number(),
      WireFormat::WireTypeForFieldType(field->type()));

    printer->Print(
      "case $tag$: {\n",
      "tag", SimpleItoa(tag));
    printer->Indent();

    field_generators_.get(field).GenerateMergingCode(printer);

    printer->Outdent();
    printer->Print(
      "  break;\n"
      "}\n");

    if (field->is_packable()) {
      // To make packed = true wire compatible, we generate parsing code from a
      // packed version of this field regardless of field->options().packed().
      uint32 packed_tag = WireFormatLite::MakeTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      printer->Print(
        "case $tag$: {\n",
        "tag", SimpleItoa(packed_tag));
      printer->Indent();

      field_generators_.get(field).GenerateMergingCodeFromPacked(printer);

      printer->Outdent();
      printer->Print(
        "  break;\n"
        "}\n");
    }
  }

  printer->Outdent();
  printer->Outdent();
  printer->Outdent();
  printer->Print(
    "    }\n"     // switch (tag)
    "  }\n"       // while (true)
    "}\n");
}